

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

void __thiscall brynet::net::AcceptError::AcceptError(AcceptError *this,int errorCode)

{
  string local_38;
  int local_14;
  AcceptError *pAStack_10;
  int errorCode_local;
  AcceptError *this_local;
  
  local_14 = errorCode;
  pAStack_10 = this;
  std::__cxx11::to_string(&local_38,errorCode);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__AcceptError_001fd780;
  this->mErrorCode = local_14;
  return;
}

Assistant:

AcceptError(int errorCode) 
                : 
                std::runtime_error(std::to_string(errorCode)), 
                mErrorCode(errorCode)
            {}